

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_splice(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  undefined4 uVar1;
  int iVar2;
  vm_obj_id_t obj;
  size_t sVar3;
  CVmObject *ele_array;
  uint *in_RCX;
  char *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  uint i;
  int dst;
  CVmObjList *new_lst;
  int ins_cnt;
  int del_cnt;
  int start_idx;
  int lst_cnt;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff58;
  CVmObjList *in_stack_ffffffffffffff60;
  vm_val_t *in_stack_ffffffffffffff68;
  CVmObject *in_stack_ffffffffffffff70;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  int local_44;
  
  if (in_RCX == (uint *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = *in_RCX;
  }
  if ((getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_splice::desc,2,0,1);
    __cxa_guard_release(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff68,(uint *)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
  if (iVar2 == 0) {
    sVar3 = vmb_get_len((char *)0x319e3d);
    iVar2 = (int)sVar3;
    local_44 = CVmBif::pop_int_val();
    local_74 = CVmBif::pop_int_val();
    if (local_44 < 1) {
      local_44 = iVar2 + 1 + local_44;
    }
    local_6c = local_44 + -1;
    if (local_6c < 0) {
      local_68 = 0;
    }
    else {
      if (iVar2 < local_6c) {
        local_6c = iVar2;
      }
      local_68 = local_6c;
    }
    if (local_74 < 0) {
      local_70 = 0;
    }
    else {
      if (iVar2 - local_68 < local_74) {
        local_74 = iVar2 - local_68;
      }
      local_70 = local_74;
    }
    if ((local_70 == 0) && (local_64 == 2)) {
      uVar1 = *(undefined4 *)&in_RSI->field_0x4;
      in_RDI->typ = in_RSI->typ;
      *(undefined4 *)&in_RDI->field_0x4 = uVar1;
      in_RDI->val = in_RSI->val;
    }
    else {
      CVmStack::push(in_RSI);
      obj = create((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(size_t)in_stack_ffffffffffffff58
                  );
      vm_val_t::set_obj(in_RDI,obj);
      ele_array = vm_objp(0);
      CVmStack::push(in_RDI);
      local_5c = 0;
      if (0 < local_68) {
        cons_copy_data((CVmObjList *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                       (char *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
        local_5c = local_68;
      }
      for (local_60 = 2; local_60 < local_64; local_60 = local_60 + 1) {
        local_5c = local_5c + 1;
        in_stack_ffffffffffffff70 = ele_array;
        CVmStack::get((ulong)local_60);
        cons_set_element(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                         (vm_val_t *)0x319ff2);
      }
      if (local_68 + local_70 < iVar2) {
        sVar3 = (size_t)local_5c;
        get_element_ptr_const(in_RDX,(long)(local_68 + local_70));
        cons_copy_data((CVmObjList *)in_stack_ffffffffffffff70,sVar3,(char *)ele_array,
                       (size_t)in_stack_ffffffffffffff58);
      }
      CVmStack::discard(local_64);
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_splice(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* remember the length of my list */
    int lst_cnt = vmb_get_len(lst);

    /* retrieve the starting index and deletion length arguments */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int del_cnt = CVmBif::pop_int_val(vmg0_);

    /* a negative starting index counts from the end of the list */
    if (start_idx <= 0)
        start_idx += lst_cnt + 1;

    /* adjust to zero-based indexing */
    --start_idx;

    /* make sure the values are in range */
    start_idx = (start_idx < 0 ? 0 :
                 start_idx > lst_cnt ? lst_cnt :
                 start_idx);
    del_cnt = (del_cnt < 0 ? 0 :
               del_cnt > lst_cnt - start_idx ? lst_cnt - start_idx :
               del_cnt);

    /* figure the insertion size: each argument is a value to insert */
    int ins_cnt = argc - 2;

    /* if we're making any changes, build the new list */
    if (del_cnt != 0 || ins_cnt != 0)
    {
        /* put myself on the stack for GC protection */
        G_stk->push(self_val);

        /* create a list to store the return value */
        retval->set_obj(create(vmg_ FALSE, lst_cnt + ins_cnt - del_cnt));
        CVmObjList *new_lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

        /* push a reference to the new list for gc protection */
        G_stk->push(retval);
        
        /* copy elements from the original up to the starting index */
        int dst = 0;
        if (start_idx > 0)
        {
            new_lst->cons_copy_data(0, lst + VMB_LEN, start_idx);
            dst = start_idx;
        }
        
        /* 
         *   Add the inserted items from the arguments.  We popped our first
         *   two arguments, but then we pushed two items for gc protection,
         *   so conveniently the inserted items are just args 2..argc-1 
         */
        for (uint i = 2 ; i < argc ; ++i)
            new_lst->cons_set_element(dst++, G_stk->get(i));
        
        /* copy the remaining elements after the deleted segment, if any */
        if (lst_cnt > start_idx + del_cnt)
        {
            new_lst->cons_copy_data(
                dst, get_element_ptr_const(lst, start_idx + del_cnt),
                lst_cnt - (start_idx + del_cnt));
        }   
        
        /* 
         *   Discard the gc protection and insertion arguments.  We added two
         *   elements for gc protection, and popped two arguments, so the net
         *   is the original argument count.  
         */
        G_stk->discard(argc);
    }
    else
    {
        /* 
         *   There's nothing to do - just return the original list.  (There's
         *   nothing to discard from the stack: we have no more arguments,
         *   since ins_cnt is zero, and we haven't pushed any gc protection
         *   elements.) 
         */
        *retval = *self_val;
    }

    /* handled */
    return TRUE;
}